

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O1

plutovg_paint_t *
plutovg_paint_create_radial_gradient
          (float cx,float cy,float cr,float fx,float fy,float fr,plutovg_spread_method_t spread,
          plutovg_gradient_stop_t *stops,int nstops,plutovg_matrix_t *matrix)

{
  plutovg_gradient_paint_t *ppVar1;
  
  ppVar1 = plutovg_gradient_create(PLUTOVG_GRADIENT_TYPE_RADIAL,spread,stops,nstops,matrix);
  ppVar1->values[0] = cx;
  ppVar1->values[1] = cy;
  ppVar1->values[2] = cr;
  ppVar1->values[3] = fx;
  ppVar1->values[4] = fy;
  ppVar1->values[5] = fr;
  return &ppVar1->base;
}

Assistant:

plutovg_paint_t* plutovg_paint_create_radial_gradient(float cx, float cy, float cr, float fx, float fy, float fr, plutovg_spread_method_t spread, const plutovg_gradient_stop_t* stops, int nstops, const plutovg_matrix_t* matrix)
{
    plutovg_gradient_paint_t* gradient = plutovg_gradient_create(PLUTOVG_GRADIENT_TYPE_RADIAL, spread, stops, nstops, matrix);
    gradient->values[0] = cx;
    gradient->values[1] = cy;
    gradient->values[2] = cr;
    gradient->values[3] = fx;
    gradient->values[4] = fy;
    gradient->values[5] = fr;
    return &gradient->base;
}